

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O3

void __thiscall
QMenuBarPrivate::setCurrentAction
          (QMenuBarPrivate *this,QAction *action,bool popup,bool activateFirst)

{
  QWidget *this_00;
  char cVar1;
  QAction *pQVar2;
  QWidget *this_01;
  Data *pDVar3;
  QAction *act;
  QWidget *this_02;
  long in_FS_OFFSET;
  bool bVar4;
  QStatusTipEvent tip;
  QWidget *local_98;
  undefined1 local_88 [16];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QArrayData *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->currentAction).wp.d;
  if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
    pQVar2 = (QAction *)0x0;
  }
  else {
    pQVar2 = (QAction *)(this->currentAction).wp.value;
  }
  if ((pQVar2 == action) && (((this->field_0x2a0 ^ popup) & 1) == 0)) goto LAB_0046449f;
  QBasicTimer::stop();
  pDVar3 = (this->activeMenu).wp.d;
  if (popup) {
    if (pDVar3 == (Data *)0x0) {
      this->doChildEffects = true;
      this_02 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
      goto LAB_004642ae;
    }
    this->doChildEffects =
         (this->activeMenu).wp.value == (QObject *)0x0 || *(int *)(pDVar3 + 4) == 0;
    this_02 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
LAB_00464252:
    if ((*(int *)(pDVar3 + 4) == 0) ||
       (this_00 = (QWidget *)(this->activeMenu).wp.value, this_00 == (QWidget *)0x0))
    goto LAB_004642ae;
    (this->activeMenu).wp.d = (Data *)0x0;
    (this->activeMenu).wp.value = (QObject *)0x0;
    LOCK();
    *(int *)pDVar3 = *(int *)pDVar3 + -1;
    UNLOCK();
    if (*(int *)pDVar3 == 0) {
      operator_delete(pDVar3);
    }
    if (popup) {
      this_01 = QWidget::window(this_02);
      local_98 = QWidget::focusWidget(this_01);
      QWidget::setFocus(this_02,NoFocusReason);
    }
    else {
      local_98 = (QWidget *)0x0;
    }
    QWidget::hide(this_00);
  }
  else {
    this->doChildEffects = false;
    this_02 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    if (pDVar3 != (Data *)0x0) goto LAB_00464252;
LAB_004642ae:
    local_98 = (QWidget *)0x0;
  }
  pQVar2 = (QAction *)(this->currentAction).wp.d;
  if (pQVar2 == (QAction *)0x0) {
    this->field_0x2a0 = this->field_0x2a0 & 0xfe | popup;
    bVar4 = true;
    pQVar2 = (QAction *)0x0;
  }
  else {
    act = (QAction *)(this->currentAction).wp.value;
    if (*(int *)(pQVar2 + 4) == 0 || act == (QAction *)0x0) {
      this->field_0x2a0 = this->field_0x2a0 & 0xfe | popup;
    }
    else {
      if (*(int *)(pQVar2 + 4) == 0) {
        act = (QAction *)0x0;
      }
      local_88 = (undefined1  [16])actionRect(this,act);
      QWidget::update(this_02,(QRect *)local_88);
      pQVar2 = (QAction *)(this->currentAction).wp.d;
      this->field_0x2a0 = this->field_0x2a0 & 0xfe | popup;
      if (pQVar2 == (QAction *)0x0) {
        bVar4 = true;
        pQVar2 = (QAction *)0x0;
        goto LAB_00464382;
      }
    }
    if (*(int *)(pQVar2 + 4) == 0) {
      bVar4 = true;
    }
    else {
      bVar4 = (this->currentAction).wp.value == (QObject *)0x0;
    }
  }
LAB_00464382:
  if (action == (QAction *)0x0) {
    pDVar3 = (Data *)0x0;
  }
  else {
    pDVar3 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)action);
    pQVar2 = (QAction *)(this->currentAction).wp.d;
  }
  (this->currentAction).wp.d = pDVar3;
  (this->currentAction).wp.value = (QObject *)action;
  if (pQVar2 != (QAction *)0x0) {
    LOCK();
    *(int *)pQVar2 = *(int *)pQVar2 + -1;
    UNLOCK();
    if (*(int *)pQVar2 == 0) {
      operator_delete(pQVar2);
    }
  }
  if ((action == (QAction *)0x0) || (cVar1 = QAction::isEnabled(), cVar1 == '\0')) {
    if (!bVar4) {
      local_58 = (QArrayData *)0x0;
      uStack_50 = 0;
      local_48 = 0;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStatusTipEvent::QStatusTipEvent((QStatusTipEvent *)local_88,(QString *)&local_58);
      QCoreApplication::sendEvent(&this_02->super_QObject,(QEvent *)local_88);
      QStatusTipEvent::~QStatusTipEvent((QStatusTipEvent *)local_88);
      if (local_58 != (QArrayData *)0x0) {
        LOCK();
        (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_58,2,0x10);
        }
      }
    }
  }
  else {
    activateAction(this,action,Hover);
    if (popup) {
      popupAction(this,action,activateFirst);
    }
    local_88 = (undefined1  [16])actionRect(this,action);
    QWidget::update(this_02,(QRect *)local_88);
  }
  if (local_98 != (QWidget *)0x0) {
    QWidget::setFocus(local_98,NoFocusReason);
  }
LAB_0046449f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuBarPrivate::setCurrentAction(QAction *action, bool popup, bool activateFirst)
{
    if (currentAction == action && popup == popupState)
        return;

    autoReleaseTimer.stop();

    doChildEffects = (popup && !activeMenu);
    Q_Q(QMenuBar);
    QWidget *fw = nullptr;
    if (QMenu *menu = activeMenu) {
        activeMenu = nullptr;
        if (popup) {
            fw = q->window()->focusWidget();
            q->setFocus(Qt::NoFocusReason);
        }
        menu->hide();
    }

    if (currentAction)
        q->update(actionRect(currentAction));

    popupState = popup;
#if QT_CONFIG(statustip)
    QAction *previousAction = currentAction;
#endif
    currentAction = action;
    if (action && action->isEnabled()) {
        activateAction(action, QAction::Hover);
        if (popup)
            popupAction(action, activateFirst);
        q->update(actionRect(action));
#if QT_CONFIG(statustip)
    }  else if (previousAction) {
        QString empty;
        QStatusTipEvent tip(empty);
        QCoreApplication::sendEvent(q, &tip);
#endif
    }
    if (fw)
        fw->setFocus(Qt::NoFocusReason);
}